

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::VisitDescriptorsTest_AllTypesDeduce_Test::
VisitDescriptorsTest_AllTypesDeduce_Test(VisitDescriptorsTest_AllTypesDeduce_Test *this)

{
  VisitDescriptorsTest_AllTypesDeduce_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__VisitDescriptorsTest_AllTypesDeduce_Test_029bc490;
  return;
}

Assistant:

TEST(VisitDescriptorsTest, AllTypesDeduce) {
  const FileDescriptor& file =
      *proto2_unittest::TestAllTypes::GetDescriptor()->file();
  std::vector<absl::string_view> descriptors;
  VisitDescriptors(file, [&](const auto& descriptor) {
    descriptors.push_back(descriptor.name());
  });
  EXPECT_THAT(descriptors, Contains(kUnittestProtoFile));
  EXPECT_THAT(descriptors, IsSupersetOf({"TestAllTypes", "TestSparseEnum",
                                         "SPARSE_C", "optional_int32",
                                         "oneof_nested_message", "oneof_field",
                                         "optional_nested_message_extension"}));
}